

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O0

void bng_bout1(t_bng *x)

{
  t_bng *x_local;
  
  if (((uint)(x->x_gui).x_fsf >> 0x1a & 1) == 0) {
    (x->x_gui).x_isa = (t_iem_init_symargs)((uint)(x->x_gui).x_isa & 0xf7ffffff | 0x8000000);
    clock_delay(x->x_clock_lck,2.0);
  }
  outlet_bang((x->x_gui).x_obj.te_outlet);
  if (((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) && (((x->x_gui).x_snd)->s_thing != (_class **)0x0))
     && (((uint)(x->x_gui).x_fsf >> 0x1a & 1) != 0)) {
    pd_bang(((x->x_gui).x_snd)->s_thing);
  }
  return;
}

Assistant:

static void bng_bout1(t_bng *x) /* wird nur mehr gesendet, wenn snd != rcv*/
{
    if(!x->x_gui.x_fsf.x_put_in2out)
    {
        x->x_gui.x_isa.x_locked = 1;
        clock_delay(x->x_clock_lck, 2);
    }
    outlet_bang(x->x_gui.x_obj.ob_outlet);
    if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing && x->x_gui.x_fsf.x_put_in2out)
        pd_bang(x->x_gui.x_snd->s_thing);
}